

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O1

ResultCallback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*> *
google::protobuf::internal::CheckNotNull<google::protobuf::ResultCallback<std::__cxx11::string*>>
          (char *param_1,int param_2,char *name,
          ResultCallback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          *val)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (val == (ResultCallback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
              *)0x0) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/logging.h"
               ,0xa6);
    other = LogMessage::operator<<(&local_50,name);
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
  }
  return val;
}

Assistant:

T* CheckNotNull(const char* /* file */, int /* line */,
                const char* name, T* val) {
  if (val == NULL) {
    GOOGLE_LOG(FATAL) << name;
  }
  return val;
}